

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# word.c
# Opt level: O0

RSIZE countfword(void)

{
  int iVar1;
  line *plVar2;
  int iVar3;
  int doto;
  line *dotp;
  RSIZE size;
  
  plVar2 = curwp->w_dotp;
  iVar1 = curwp->w_doto;
  dotp._4_4_ = 0;
  while ((iVar3 = inword(), iVar3 != 0 && (iVar3 = forwchar(8,1), iVar3 != 0))) {
    dotp._4_4_ = dotp._4_4_ + 1;
  }
  curwp->w_dotp = plVar2;
  curwp->w_doto = iVar1;
  return dotp._4_4_;
}

Assistant:

RSIZE
countfword()
{
	RSIZE		 size;
	struct line	*dotp;
	int		 doto;

	dotp = curwp->w_dotp;
	doto = curwp->w_doto;
	size = 0;

	while (inword() != FALSE) {
		if (forwchar(FFRAND, 1) == FALSE)
			/* hit the end of the buffer */
			goto out;
		++size;
	}
out:
	curwp->w_dotp = dotp;
	curwp->w_doto = doto;
	return (size);
}